

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryTestsUtil.cpp
# Opt level: O2

string * __thiscall
vkt::geometry::inputTypeToGLString_abi_cxx11_
          (string *__return_storage_ptr__,geometry *this,VkPrimitiveTopology *inputType)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(*(undefined4 *)this) {
  case 0:
    __s = "points";
    __a = &local_9;
    break;
  case 1:
  case 2:
    __s = "lines";
    __a = &local_a;
    break;
  case 3:
  case 4:
  case 5:
    __s = "triangles";
    __a = &local_c;
    break;
  case 6:
  case 7:
    __s = "lines_adjacency";
    __a = &local_b;
    break;
  case 8:
  case 9:
    __s = "triangles_adjacency";
    __a = &local_d;
    break;
  default:
    __s = "error";
    __a = &local_e;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string inputTypeToGLString (const VkPrimitiveTopology& inputType)
{
	switch (inputType)
	{
		case VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
			return "points";
		case VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
			return "lines";
		case VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
			return "lines_adjacency";
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
			return "triangles";
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
			return "triangles_adjacency";
		default:
			DE_ASSERT(DE_FALSE);
			return "error";
	}
}